

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStderr.cpp
# Opt level: O3

void __thiscall liblogger::LogStderr::Log(LogStderr *this,LogType Type,string *str)

{
  pointer pcVar1;
  FILE *__stream;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  string *psVar5;
  int *piVar6;
  char *pcVar7;
  LogException *pLVar8;
  time_t current;
  stringstream ss;
  tm timeinfo;
  char buf [128];
  string local_290;
  time_t local_270;
  stringstream local_268 [16];
  ostream local_258 [376];
  tm local_e0;
  char local_a8 [128];
  
  local_270 = time((time_t *)0x0);
  localtime_r(&local_270,&local_e0);
  sVar4 = strftime(local_a8,0x80,"%F %T",&local_e0);
  __stream = _stderr;
  if (sVar4 == 0) {
    abort();
  }
  psVar5 = LogTypeToStr_abi_cxx11_(Type);
  pcVar1 = (psVar5->_M_dataplus)._M_p;
  uVar2 = getpid();
  iVar3 = fprintf(__stream,"%s - %s [PID: %d] - %s\n",local_a8,pcVar1,(ulong)uVar2,
                  (str->_M_dataplus)._M_p);
  if (-1 < iVar3) {
    iVar3 = fflush(_stderr);
    if (-1 < iVar3) {
      return;
    }
    std::__cxx11::stringstream::stringstream(local_268);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_258,"failed to flush to stderr error:",0x20);
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    std::operator<<(local_258,pcVar7);
    pLVar8 = (LogException *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    LogException::LogException(pLVar8,&local_290);
    __cxa_throw(pLVar8,&LogException::typeinfo,LogException::~LogException);
  }
  std::__cxx11::stringstream::stringstream(local_268);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_258,"failed to write to stderr error:",0x20);
  piVar6 = __errno_location();
  pcVar7 = strerror(*piVar6);
  std::operator<<(local_258,pcVar7);
  pLVar8 = (LogException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  LogException::LogException(pLVar8,&local_290);
  __cxa_throw(pLVar8,&LogException::typeinfo,LogException::~LogException);
}

Assistant:

void LogStderr::Log(const LogType Type, const std::string &str) {
	time_t current = time(NULL);
	struct tm timeinfo;
	char buf[128];

	localtime_r(&current, &timeinfo);
	if (strftime(buf, sizeof(buf), "%F %T", &timeinfo) == 0)
		abort(); //Bug

	if (fprintf(stderr, "%s - %s [PID: %d] - %s\n", buf, LogTypeToStr(Type).c_str(), getpid(), str.c_str()) < 0)
	{
		std::stringstream ss;
		ss << "failed to write to stderr error:" << strerror(errno);
		throw(LogException(ss.str()));
	}
	if (fflush(stderr) < 0)
	{
		std::stringstream ss;
		ss << "failed to flush to stderr error:" << strerror(errno);
		throw(LogException(ss.str()));
	}
}